

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ternary_executor.hpp
# Opt level: O1

string_t duckdb::TernaryLambdaWrapper::
         Operation<duckdb::ReplaceFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,duckdb::string_t,duckdb::string_t,duckdb::string_t,duckdb::string_t>
                   (anon_class_16_2_52ce5e5c fun,string_t a,string_t b,string_t c,ValidityMask *mask
                   ,idx_t idx)

{
  undefined4 *__src;
  Vector *this;
  vector<char,std::allocator<char>> *pvVar1;
  int iVar2;
  ulong uVar3;
  long lVar4;
  uint uVar5;
  void *__s1;
  ulong __n;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  anon_union_16_2_67f50693_for_value aVar9;
  string_t data;
  undefined4 uStack_8c;
  int iStack_88;
  undefined4 uStack_84;
  Vector *local_80;
  char *local_78;
  void *local_70;
  undefined8 local_68;
  char *pcStack_60;
  vector<char,std::allocator<char>> *local_58;
  undefined8 local_50;
  void *local_48;
  undefined8 local_40;
  void *local_38;
  
  local_48 = b.value._8_8_;
  local_50 = b.value._0_8_;
  local_38 = a.value._8_8_;
  local_40 = a.value._0_8_;
  local_58 = (vector<char,std::allocator<char>> *)fun.buffer;
  local_80 = fun.result;
  local_68 = c.value._0_8_;
  pcStack_60 = c.value.pointer.ptr;
  uVar3 = (ulong)a.value._0_4_;
  __s1 = local_38;
  if (uVar3 < 0xd) {
    __s1 = (void *)((long)&local_40 + 4);
  }
  __n = (ulong)b.value._0_4_;
  local_70 = local_48;
  if (__n < 0xd) {
    local_70 = (void *)((long)&local_50 + 4);
  }
  if ((c.value._0_8_ & 0xffffffff) < 0xd) {
    c.value.pointer.ptr = (char *)((long)&local_68 + 4);
  }
  if (*(pointer *)(local_58 + 8) != *(pointer *)local_58) {
    *(pointer *)(local_58 + 8) = *(pointer *)local_58;
  }
  local_78 = (char *)((long)c.value.pointer.ptr + (c.value._0_8_ & 0xffffffff));
  do {
    uVar7 = uVar3;
    if ((b.value._0_4_ != 0) && (__n <= uVar3)) {
      iVar2 = bcmp(__s1,local_70,__n);
      if (iVar2 == 0) {
        uVar7 = 0;
      }
      else {
        uVar6 = 0;
        uVar8 = uVar3;
        do {
          uVar8 = uVar8 - 1;
          uVar7 = uVar3;
          if (uVar8 < __n) break;
          iVar2 = bcmp((void *)((long)__s1 + uVar6 + 1),local_70,__n);
          uVar7 = uVar6 + 1;
          uVar6 = uVar7;
        } while (iVar2 != 0);
      }
    }
    pvVar1 = local_58;
    lVar4 = (long)__s1 + uVar7;
    ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (local_58,*(undefined8 *)(local_58 + 8),__s1);
    this = local_80;
    if (uVar3 == uVar7) {
      __src = *(undefined4 **)pvVar1;
      iStack_88 = (int)__src;
      uVar5 = (int)*(undefined8 *)(pvVar1 + 8) - iStack_88;
      if (uVar5 < 0xd) {
        uStack_84 = 0;
        uStack_8c = 0;
        iStack_88 = 0;
        if (uVar5 != 0) {
          switchD_00b1422a::default(&uStack_8c,__src,(ulong)(uVar5 & 0xf));
        }
      }
      else {
        uStack_8c = *__src;
        uStack_84 = (undefined4)((ulong)__src >> 0x20);
      }
      data.value._4_1_ = (undefined1)uStack_84;
      data.value._5_1_ = uStack_84._1_1_;
      data.value._6_1_ = uStack_84._2_1_;
      data.value._7_1_ = uStack_84._3_1_;
      data.value.pointer.length = iStack_88;
      data.value.pointer.ptr = (char *)lVar4;
      aVar9.pointer =
           (anon_struct_16_3_d7536bce_for_pointer)
           StringVector::AddString((StringVector *)this,(Vector *)CONCAT44(uStack_8c,uVar5),data);
      return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar9.pointer;
    }
    ::std::vector<char,std::allocator<char>>::_M_range_insert<char_const*>
              (pvVar1,*(undefined8 *)(pvVar1 + 8),c.value.pointer.ptr);
    __s1 = (void *)((long)__s1 + uVar7 + __n);
    uVar3 = (uVar3 - uVar7) - __n;
  } while( true );
}

Assistant:

static inline RESULT_TYPE Operation(FUN fun, A_TYPE a, B_TYPE b, C_TYPE c, ValidityMask &mask, idx_t idx) {
		return fun(a, b, c);
	}